

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O3

Vec<Hpipe::BranchSet::Range> * __thiscall
Hpipe::Vec<Hpipe::BranchSet::Range>::without
          (Vec<Hpipe::BranchSet::Range> *__return_storage_ptr__,Vec<Hpipe::BranchSet::Range> *this,
          uint index)

{
  iterator __position;
  Instruction *pIVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  pointer pRVar6;
  Range *__args;
  uint uVar7;
  
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::reserve
            (&__return_storage_ptr__->
              super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>,
             ((long)(this->
                    super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
                    .
                    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->
                    super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
                    .
                    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
  pRVar6 = (this->super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
           super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
      super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar6) {
    uVar7 = 1;
    uVar5 = 0;
    do {
      if (uVar7 - index != 1) {
        __args = pRVar6 + uVar5;
        __position._M_current =
             (__return_storage_ptr__->
             super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
             super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
            super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>::
          _M_realloc_insert<Hpipe::BranchSet::Range_const&>
                    ((vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>> *)
                     __return_storage_ptr__,__position,__args);
        }
        else {
          iVar3 = __args->beg;
          iVar4 = __args->end;
          pIVar1 = __args->inst;
          dVar2 = __args->freq;
          (__position._M_current)->name = __args->name;
          (__position._M_current)->freq = dVar2;
          (__position._M_current)->beg = iVar3;
          (__position._M_current)->end = iVar4;
          (__position._M_current)->inst = pIVar1;
          (__return_storage_ptr__->
          super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
          super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar5 = (ulong)uVar7;
      pRVar6 = (this->
               super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
               super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
    } while (uVar5 < (ulong)((long)(this->
                                   super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                                   ).
                                   super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar6 >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

Vec      without              ( unsigned index             ) const { Vec res; res.reserve( this->size() - 1   ); for( unsigned i = 0  ; i < this->size(); ++i ) if ( i != index ) res << this->operator[]( i ); return res; }